

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepared-c.cpp
# Opt level: O2

void duckdb_destroy<duckdb::ExtractStatementsWrapper>(void **wrapper)

{
  ExtractStatementsWrapper *this;
  
  if (wrapper != (void **)0x0) {
    this = (ExtractStatementsWrapper *)*wrapper;
    if (this != (ExtractStatementsWrapper *)0x0) {
      duckdb::ExtractStatementsWrapper::~ExtractStatementsWrapper(this);
      operator_delete(this);
    }
    *wrapper = (void *)0x0;
  }
  return;
}

Assistant:

void duckdb_destroy(void **wrapper) {
	if (!wrapper) {
		return;
	}

	auto casted = (T *)*wrapper;
	if (casted) {
		delete casted;
	}
	*wrapper = nullptr;
}